

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void google::protobuf::MessageFactory::InternalRegisterGeneratedMessage
               (Descriptor *descriptor,Message *prototype)

{
  DescriptorPool *pDVar1;
  GeneratedMessageFactory *pGVar2;
  DescriptorPool *pDVar3;
  LogMessage *pLVar4;
  pair<std::tr1::__detail::_Hashtable_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_false,_false>,_bool>
  ret;
  Descriptor *local_68;
  Message *local_60;
  LogMessage local_58;
  
  pGVar2 = anon_unknown_0::GeneratedMessageFactory::singleton();
  pDVar1 = *(DescriptorPool **)(*(long *)(descriptor + 0x10) + 0x10);
  pDVar3 = DescriptorPool::generated_pool();
  if (pDVar1 != pDVar3) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message.cc"
               ,0x11e);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (descriptor->file()->pool()) == (DescriptorPool::generated_pool()): "
                       );
    pLVar4 = internal::LogMessage::operator<<
                       (pLVar4,
                        "Tried to register a non-generated type with the generated type registry.");
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar4);
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::Mutex::AssertHeld(&pGVar2->mutex_);
  local_68 = descriptor;
  local_60 = prototype;
  std::tr1::
  _Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  ::_M_insert(&local_58,
              (_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
               *)&pGVar2->type_map_);
  if ((char)local_58.line_ == '\0') {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message.cc"
               ,0x127);
    pLVar4 = internal::LogMessage::operator<<(&local_58,"Type is already registered: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,*(string **)(descriptor + 8));
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar4);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedMessage(
    const Descriptor* descriptor, const Message* prototype) {
  GeneratedMessageFactory::singleton()->RegisterType(descriptor, prototype);
}